

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLinearRangeValid(LookupPrecision *prec,Vec4 *c0,Vec4 *c1,Vec2 *fBounds,Vec4 *result)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  int i;
  long lVar7;
  bool bVar8;
  Vec4 rMin;
  Vec4 rMax;
  Vec4 i1;
  Vec4 i0;
  
  fVar1 = fBounds->m_data[0];
  i1.m_data[0] = 0.0;
  i1.m_data[1] = 0.0;
  i1.m_data[2] = 0.0;
  i1.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    i1.m_data[lVar7] = c0->m_data[lVar7] * (1.0 - fVar1);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  rMin.m_data[0] = 0.0;
  rMin.m_data[1] = 0.0;
  rMin.m_data[2] = 0.0;
  rMin.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    rMin.m_data[lVar7] = c1->m_data[lVar7] * fVar1;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  i0.m_data[0] = 0.0;
  i0.m_data[1] = 0.0;
  i0.m_data[2] = 0.0;
  i0.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    i0.m_data[lVar7] = i1.m_data[lVar7] + rMin.m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  fVar1 = fBounds->m_data[1];
  rMin.m_data[0] = 0.0;
  rMin.m_data[1] = 0.0;
  rMin.m_data[2] = 0.0;
  rMin.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    rMin.m_data[lVar7] = c0->m_data[lVar7] * (1.0 - fVar1);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  rMax.m_data[0] = 0.0;
  rMax.m_data[1] = 0.0;
  rMax.m_data[2] = 0.0;
  rMax.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    rMax.m_data[lVar7] = c1->m_data[lVar7] * fVar1;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  i1.m_data[0] = 0.0;
  i1.m_data[1] = 0.0;
  i1.m_data[2] = 0.0;
  i1.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    i1.m_data[lVar7] = rMin.m_data[lVar7] + rMax.m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  rMin.m_data[0] = 0.0;
  rMin.m_data[1] = 0.0;
  rMin.m_data[2] = 0.0;
  rMin.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    rMin.m_data[lVar7] = result->m_data[lVar7] - (prec->colorThreshold).m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  rMax.m_data[0] = 0.0;
  rMax.m_data[1] = 0.0;
  rMax.m_data[2] = 0.0;
  rMax.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    rMax.m_data[lVar7] = result->m_data[lVar7] + (prec->colorThreshold).m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  bVar8 = true;
  lVar7 = 0;
  do {
    if ((prec->colorMask).m_data[lVar7] == true) {
      fVar1 = i0.m_data[lVar7];
      fVar2 = rMin.m_data[lVar7];
      fVar3 = i1.m_data[lVar7];
      if (fVar1 < fVar2 == fVar2 <= fVar3) {
LAB_00abf0c1:
        bVar5 = true;
        bVar6 = bVar8;
      }
      else {
        fVar4 = rMax.m_data[lVar7];
        if (fVar4 < fVar3 != fVar4 < fVar1) goto LAB_00abf0c1;
        bVar5 = false;
        bVar6 = false;
        if (fVar2 <= fVar3 != fVar4 < fVar1) goto LAB_00abf0c1;
      }
      bVar8 = bVar6;
      if (!bVar5) {
        return bVar6;
      }
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 4) {
      return bVar8;
    }
  } while( true );
}

Assistant:

static bool isLinearRangeValid (const LookupPrecision&	prec,
								const Vec4&				c0,
								const Vec4&				c1,
								const Vec2&				fBounds,
								const Vec4&				result)
{
	// This is basically line segment - AABB test. Valid interpolation line is checked
	// against result AABB constructed by applying threshold.

	const Vec4		i0				= c0*(1.0f - fBounds[0]) + c1*fBounds[0];
	const Vec4		i1				= c0*(1.0f - fBounds[1]) + c1*fBounds[1];
	const Vec4		rMin			= result - prec.colorThreshold;
	const Vec4		rMax			= result + prec.colorThreshold;
	bool			allIntersect	= true;

	// Algorithm: For each component check whether segment endpoints are inside, or intersect with slab.
	// If all intersect or are inside, line segment intersects the whole 4D AABB.
	for (int compNdx = 0; compNdx < 4; compNdx++)
	{
		if (!prec.colorMask[compNdx])
			continue;

		// Signs for both bounds: false = left, true = right.
		const bool	sMin0	= i0[compNdx] >= rMin[compNdx];
		const bool	sMin1	= i1[compNdx] >= rMin[compNdx];
		const bool	sMax0	= i0[compNdx] > rMax[compNdx];
		const bool	sMax1	= i1[compNdx] > rMax[compNdx];

		// If all signs are equal, line segment is outside bounds.
		if (sMin0 == sMin1 && sMin1 == sMax0 && sMax0 == sMax1)
		{
			allIntersect = false;
			break;
		}
	}

	return allIntersect;
}